

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::UnshuffleTests(UnitTestImpl *this)

{
  size_type sVar1;
  reference ppTVar2;
  reference pvVar3;
  ulong local_18;
  size_t i;
  UnitTestImpl *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                      (&this->test_cases_);
    if (sVar1 <= local_18) break;
    ppTVar2 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        (&this->test_cases_,local_18);
    TestCase::UnshuffleTests(*ppTVar2);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->test_case_indices_,local_18);
    *pvVar3 = (value_type)local_18;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void UnitTestImpl::UnshuffleTests() {
  for (size_t i = 0; i < test_cases_.size(); i++) {
    // Unshuffles the tests in each test case.
    test_cases_[i]->UnshuffleTests();
    // Resets the index of each test case.
    test_case_indices_[i] = static_cast<int>(i);
  }
}